

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Packing_x86_fma::forward_int8
          (Packing_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint _h;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  _func_int **pp_Var18;
  Packing *this_00;
  long lVar19;
  long lVar20;
  int iVar21;
  uint _elempack;
  long lVar22;
  int i;
  int iVar23;
  int iVar24;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  
  pp_Var18 = this->_vptr_Packing_x86_fma;
  this_00 = (Packing *)((long)&this->_vptr_Packing_x86_fma + (long)pp_Var18[-3]);
  if (*(int *)(&this->field_0xd4 + (long)pp_Var18[-3]) != 0) {
LAB_0044f10c:
    iVar14 = Packing::forward(this_00,bottom_blob,top_blob,opt);
    return iVar14;
  }
  uVar1 = bottom_blob->elempack;
  uVar17 = (ulong)uVar1;
  _elempack = this_00->out_elempack;
  if (uVar1 != _elempack) {
    uVar4 = bottom_blob->elemsize;
    bVar10 = _elempack != 1;
    bVar11 = uVar1 != 8;
    bVar8 = _elempack == 8;
    bVar9 = uVar1 == 1;
    if ((!bVar8 || !bVar9) && (bVar10 || bVar11)) goto LAB_0044f10c;
    iVar14 = bottom_blob->dims;
    iVar23 = bottom_blob->w;
    _h = bottom_blob->h;
    if (iVar14 == 2) {
      uVar7 = (long)(int)(_h * uVar1) / (long)(int)_elempack;
      if ((int)(_h * uVar1) % (int)_elempack == 0) {
        iVar14 = (int)uVar7;
        Mat::create(top_blob,iVar23,iVar14,(ulong)_elempack * (uVar4 / uVar17),_elempack,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((bVar8 && bVar9) && 0 < iVar14) {
            local_80 = 7;
            local_78 = 6;
            local_48 = 5;
            local_50 = 4;
            local_58 = 3;
            local_60 = 2;
            local_68 = 1;
            local_70 = 0;
            uVar17 = 0;
            do {
              if (0 < iVar23) {
                sVar15 = bottom_blob->elemsize;
                lVar19 = (long)bottom_blob->w;
                lVar16 = top_blob->elemsize * uVar17 * (long)top_blob->w;
                pvVar5 = bottom_blob->data;
                pvVar6 = top_blob->data;
                lVar20 = 0;
                do {
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_70 * lVar19);
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 1) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_68 * lVar19);
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 2) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_60 * lVar19);
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 3) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_58 * lVar19);
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 4) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_50 * lVar19);
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 5) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_48 * lVar19);
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 6) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_78 * lVar19);
                  *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 7) =
                       *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_80 * lVar19);
                  lVar20 = lVar20 + 1;
                } while (iVar23 != (int)lVar20);
              }
              uVar17 = uVar17 + 1;
              local_80 = local_80 + 8;
              local_78 = local_78 + 8;
              local_48 = local_48 + 8;
              local_50 = local_50 + 8;
              local_58 = local_58 + 8;
              local_60 = local_60 + 8;
              local_68 = local_68 + 8;
              local_70 = local_70 + 8;
            } while (uVar17 != (uVar7 & 0xffffffff));
          }
          if ((bVar10 || bVar11) || (int)_h < 1) {
            return 0;
          }
          local_80 = 7;
          local_78 = 6;
          local_48 = 5;
          local_50 = 4;
          local_58 = 3;
          local_60 = 2;
          local_68 = 1;
          local_70 = 0;
          uVar17 = 0;
          do {
            if (0 < iVar23) {
              pvVar5 = top_blob->data;
              sVar15 = top_blob->elemsize;
              lVar19 = (long)top_blob->w;
              lVar16 = bottom_blob->elemsize * uVar17 * (long)bottom_blob->w;
              pvVar6 = bottom_blob->data;
              lVar20 = 0;
              do {
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_70 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16);
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_68 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 1);
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_60 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 2);
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_58 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 3);
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_50 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 4);
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_48 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 5);
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_78 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 6);
                *(undefined1 *)((long)pvVar5 + lVar20 + sVar15 * local_80 * lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar16 + 7);
                lVar20 = lVar20 + 1;
              } while (iVar23 != (int)lVar20);
            }
            uVar17 = uVar17 + 1;
            local_80 = local_80 + 8;
            local_78 = local_78 + 8;
            local_48 = local_48 + 8;
            local_50 = local_50 + 8;
            local_58 = local_58 + 8;
            local_60 = local_60 + 8;
            local_68 = local_68 + 8;
            local_70 = local_70 + 8;
          } while (uVar17 != _h);
          return 0;
        }
        return -100;
      }
    }
    else if (iVar14 == 1) {
      iVar23 = iVar23 * uVar1;
      if (iVar23 % (int)_elempack == 0) {
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar14 = bottom_blob->w;
          iVar24 = bottom_blob->h;
          iVar21 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar14;
          top_blob->h = iVar24;
          top_blob->d = iVar21;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
          pp_Var18 = this->_vptr_Packing_x86_fma;
          _elempack = *(uint *)(&this->field_0xd0 + (long)pp_Var18[-3]);
        }
        top_blob->w = iVar23 / (int)_elempack;
        top_blob->cstep = (long)(iVar23 / *(int *)(&this->field_0xd0 + (long)pp_Var18[-3]));
        top_blob->elemsize =
             (long)*(int *)(&this->field_0xd0 + (long)pp_Var18[-3]) * (uVar4 / uVar17);
        top_blob->elempack = *(int *)(&this->field_0xd0 + (long)pp_Var18[-3]);
        return 0;
      }
    }
    else {
      if (1 < iVar14 - 3U) {
        return 0;
      }
      uVar2 = bottom_blob->c;
      if ((int)(uVar1 * uVar2) % (int)_elempack == 0) {
        iVar24 = bottom_blob->d;
        uVar7 = (long)(int)(uVar1 * uVar2) / (long)(int)_elempack;
        sVar15 = (uVar4 / uVar17) * (ulong)_elempack;
        iVar21 = (int)uVar7;
        if (iVar14 == 3) {
          Mat::create(top_blob,iVar23,_h,iVar21,sVar15,_elempack,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,iVar23,_h,iVar24,iVar21,sVar15,_elempack,opt->blob_allocator);
        }
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        iVar24 = iVar23 * _h * iVar24;
        if ((bVar8 && bVar9) && 0 < iVar21) {
          lVar16 = 0;
          uVar17 = 0;
          do {
            if (0 < iVar24) {
              lVar19 = top_blob->cstep * top_blob->elemsize * uVar17;
              pvVar5 = top_blob->data;
              lVar20 = bottom_blob->cstep * bottom_blob->elemsize;
              pvVar6 = bottom_blob->data;
              lVar22 = 0;
              do {
                lVar12 = lVar22 + lVar20 * lVar16;
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19) =
                     *(undefined1 *)((long)pvVar6 + lVar22 + lVar20 * lVar16);
                lVar13 = lVar20 + lVar12;
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19 + 1) =
                     *(undefined1 *)((long)pvVar6 + lVar20 + lVar12);
                lVar12 = lVar20 + lVar13;
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19 + 2) =
                     *(undefined1 *)((long)pvVar6 + lVar20 + lVar13);
                lVar13 = lVar20 + lVar12;
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19 + 3) =
                     *(undefined1 *)((long)pvVar6 + lVar20 + lVar12);
                lVar12 = lVar20 + lVar13;
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19 + 4) =
                     *(undefined1 *)((long)pvVar6 + lVar20 + lVar13);
                lVar13 = lVar20 + lVar12;
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19 + 5) =
                     *(undefined1 *)((long)pvVar6 + lVar20 + lVar12);
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19 + 6) =
                     *(undefined1 *)((long)pvVar6 + lVar20 + lVar13);
                *(undefined1 *)((long)pvVar5 + lVar22 * 8 + lVar19 + 7) =
                     *(undefined1 *)((long)pvVar6 + lVar20 * 2 + lVar13);
                lVar22 = lVar22 + 1;
              } while (iVar24 != (int)lVar22);
            }
            uVar17 = uVar17 + 1;
            lVar16 = lVar16 + 8;
          } while (uVar17 != (uVar7 & 0xffffffff));
        }
        if ((bVar10 || bVar11) || (int)uVar2 < 1) {
          return 0;
        }
        lVar16 = 0;
        uVar17 = 0;
        do {
          if (0 < iVar24) {
            lVar19 = top_blob->cstep * top_blob->elemsize;
            pvVar5 = top_blob->data;
            lVar20 = bottom_blob->cstep * bottom_blob->elemsize * uVar17;
            pvVar6 = bottom_blob->data;
            lVar22 = 0;
            do {
              lVar12 = lVar22 + lVar19 * lVar16;
              *(undefined1 *)((long)pvVar5 + lVar22 + lVar19 * lVar16) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20);
              *(undefined1 *)((long)pvVar5 + lVar19 + lVar12) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 1);
              lVar12 = lVar19 + lVar12;
              *(undefined1 *)((long)pvVar5 + lVar19 + lVar12) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 2);
              lVar12 = lVar19 + lVar12;
              *(undefined1 *)((long)pvVar5 + lVar19 + lVar12) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 3);
              lVar12 = lVar19 + lVar12;
              *(undefined1 *)((long)pvVar5 + lVar19 + lVar12) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 4);
              lVar12 = lVar19 + lVar12;
              *(undefined1 *)((long)pvVar5 + lVar19 + lVar12) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 5);
              lVar12 = lVar19 + lVar12;
              *(undefined1 *)((long)pvVar5 + lVar19 + lVar12) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 6);
              *(undefined1 *)((long)pvVar5 + lVar19 * 2 + lVar12) =
                   *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 7);
              lVar22 = lVar22 + 1;
            } while (iVar24 != (int)lVar22);
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 8;
        } while (uVar17 != uVar2);
        return 0;
      }
    }
  }
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar14 = bottom_blob->w;
    iVar23 = bottom_blob->h;
    iVar24 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar14;
    top_blob->h = iVar23;
    top_blob->d = iVar24;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  return 0;
}

Assistant:

int Packing_x86_fma::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;

    if (!pack1to8 && !pack8to1)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i * 8);
                const signed char* r1 = bottom_blob.row<const signed char>(i * 8 + 1);
                const signed char* r2 = bottom_blob.row<const signed char>(i * 8 + 2);
                const signed char* r3 = bottom_blob.row<const signed char>(i * 8 + 3);
                const signed char* r4 = bottom_blob.row<const signed char>(i * 8 + 4);
                const signed char* r5 = bottom_blob.row<const signed char>(i * 8 + 5);
                const signed char* r6 = bottom_blob.row<const signed char>(i * 8 + 6);
                const signed char* r7 = bottom_blob.row<const signed char>(i * 8 + 7);

                signed char* outptr = top_blob.row<signed char>(i);

                int j = 0;
                for (; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i);

                signed char* outptr0 = top_blob.row<signed char>(i * 8);
                signed char* outptr1 = top_blob.row<signed char>(i * 8 + 1);
                signed char* outptr2 = top_blob.row<signed char>(i * 8 + 2);
                signed char* outptr3 = top_blob.row<signed char>(i * 8 + 3);
                signed char* outptr4 = top_blob.row<signed char>(i * 8 + 4);
                signed char* outptr5 = top_blob.row<signed char>(i * 8 + 5);
                signed char* outptr6 = top_blob.row<signed char>(i * 8 + 6);
                signed char* outptr7 = top_blob.row<signed char>(i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const signed char* r0 = bottom_blob.channel(q * 8);
                const signed char* r1 = bottom_blob.channel(q * 8 + 1);
                const signed char* r2 = bottom_blob.channel(q * 8 + 2);
                const signed char* r3 = bottom_blob.channel(q * 8 + 3);
                const signed char* r4 = bottom_blob.channel(q * 8 + 4);
                const signed char* r5 = bottom_blob.channel(q * 8 + 5);
                const signed char* r6 = bottom_blob.channel(q * 8 + 6);
                const signed char* r7 = bottom_blob.channel(q * 8 + 7);

                signed char* outptr = top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* r0 = bottom_blob.channel(q);

                signed char* outptr0 = top_blob.channel(q * 8);
                signed char* outptr1 = top_blob.channel(q * 8 + 1);
                signed char* outptr2 = top_blob.channel(q * 8 + 2);
                signed char* outptr3 = top_blob.channel(q * 8 + 3);
                signed char* outptr4 = top_blob.channel(q * 8 + 4);
                signed char* outptr5 = top_blob.channel(q * 8 + 5);
                signed char* outptr6 = top_blob.channel(q * 8 + 6);
                signed char* outptr7 = top_blob.channel(q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    return 0;
}